

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * __thiscall
capnp::DynamicStruct::Builder::get(Builder *__return_storage_ptr__,Builder *this,Field field)

{
  int *__return_storage_ptr___00;
  double dVar1;
  Builder value;
  PointerBuilder builder;
  Builder value_00;
  ListBuilder builder_00;
  ListBuilder builder_01;
  StructBuilder builder_02;
  StructBuilder builder_03;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  Builder value_04;
  ListSchema schema;
  ListSchema schema_00;
  Type TVar2;
  bool bVar3;
  int8_t value_05;
  char cVar4;
  uint8_t value_06;
  uchar uVar5;
  ElementSize elementSize;
  Which WVar6;
  Which WVar7;
  int16_t value_07;
  short sVar8;
  uint16_t value_08;
  unsigned_short uVar9;
  int32_t value_09;
  int iVar10;
  uint uVar11;
  StructDataOffset SVar12;
  uint32_t uVar13;
  StructPointerOffset SVar14;
  int64_t value_10;
  long lVar15;
  uint64_t uVar16;
  char *defaultValue;
  uchar *defaultValue_00;
  size_t sVar17;
  unsigned_long uVar18;
  float fVar19;
  Builder value_11;
  DynamicEnum value_12;
  word *local_600;
  word *local_5f0;
  word *local_5d8;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  Schema local_480;
  Builder local_478;
  PointerBuilder local_448;
  PointerBuilder local_430;
  Client local_418;
  PointerBuilder local_400;
  Builder local_3e8;
  Reader local_3d0;
  Schema local_3b0;
  StructSize local_3a4;
  PointerBuilder local_3a0;
  StructBuilder local_388;
  Schema local_360;
  Builder local_358;
  Schema local_328;
  StructSchema structSchema;
  PointerBuilder local_300;
  ListBuilder local_2e8;
  Type local_2c0;
  Builder local_2b0;
  Reader local_278;
  Schema local_258;
  StructSize local_24c;
  PointerBuilder local_248;
  ListBuilder local_230;
  Type local_208;
  Builder local_1f8;
  undefined1 local_1c0 [8];
  ListSchema listType;
  undefined1 local_188 [8];
  Reader typedDval_2;
  Builder local_160;
  undefined1 local_148 [8];
  Reader typedDval_1;
  DynamicEnum local_130;
  uint16_t local_11c;
  undefined1 local_118 [4];
  uint16_t typedDval;
  Reader dval;
  Reader slot;
  Type type;
  Reader proto;
  Fault local_28;
  Fault f;
  Builder *this_local;
  
  f.exception = (Exception *)StructSchema::Field::getContainingStruct(&field);
  bVar3 = Schema::operator==((Schema *)&f,(Schema *)this);
  if (!bVar3) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x10a,FAILED,"field.getContainingStruct() == schema",
               "\"`field` is not a field of this struct.\"",
               (char (*) [39])"`field` is not a field of this struct.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  verifySetInUnion(this,field);
  StructSchema::Field::getProto((Reader *)&type.field_4,&field);
  join_0x00000010_0x00000000_ = StructSchema::Field::getType(&field);
  WVar6 = capnp::schema::Field::Reader::which((Reader *)&type.field_4);
  if (WVar6 == SLOT) {
    __return_storage_ptr___00 = &dval._reader.nestingLimit;
    capnp::schema::Field::Reader::getSlot
              ((Reader *)__return_storage_ptr___00,(Reader *)&type.field_4);
    capnp::schema::Field::Slot::Reader::getDefaultValue
              ((Reader *)local_118,(Reader *)__return_storage_ptr___00);
    WVar7 = capnp::Type::which((Type *)&slot._reader.nestingLimit);
    switch(WVar7) {
    case VOID:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      _::StructBuilder::getDataField<capnp::Void>(&this->builder,SVar12);
      DynamicValue::Builder::Builder(__return_storage_ptr__);
      break;
    case BOOL:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      bVar3 = capnp::schema::Value::Reader::getBool((Reader *)local_118);
      bVar3 = (anonymous_namespace)::bitCast<bool,bool>(bVar3);
      bVar3 = _::StructBuilder::getDataField<bool>(&this->builder,SVar12,bVar3);
      DynamicValue::Builder::Builder(__return_storage_ptr__,bVar3);
      break;
    case INT8:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_05 = capnp::schema::Value::Reader::getInt8((Reader *)local_118);
      cVar4 = (anonymous_namespace)::bitCast<signed_char,signed_char>(value_05);
      cVar4 = _::StructBuilder::getDataField<signed_char>(&this->builder,SVar12,cVar4);
      DynamicValue::Builder::Builder(__return_storage_ptr__,cVar4);
      break;
    case INT16:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_07 = capnp::schema::Value::Reader::getInt16((Reader *)local_118);
      sVar8 = (anonymous_namespace)::bitCast<short,short>(value_07);
      sVar8 = _::StructBuilder::getDataField<short>(&this->builder,SVar12,sVar8);
      DynamicValue::Builder::Builder(__return_storage_ptr__,sVar8);
      break;
    case INT32:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_09 = capnp::schema::Value::Reader::getInt32((Reader *)local_118);
      iVar10 = (anonymous_namespace)::bitCast<int,int>(value_09);
      iVar10 = _::StructBuilder::getDataField<int>(&this->builder,SVar12,iVar10);
      DynamicValue::Builder::Builder(__return_storage_ptr__,iVar10);
      break;
    case INT64:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_10 = capnp::schema::Value::Reader::getInt64((Reader *)local_118);
      lVar15 = (anonymous_namespace)::bitCast<long,long>(value_10);
      lVar15 = _::StructBuilder::getDataField<long>(&this->builder,SVar12,lVar15);
      DynamicValue::Builder::Builder(__return_storage_ptr__,lVar15);
      break;
    case UINT8:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_06 = capnp::schema::Value::Reader::getUint8((Reader *)local_118);
      uVar5 = (anonymous_namespace)::bitCast<unsigned_char,unsigned_char>(value_06);
      uVar5 = _::StructBuilder::getDataField<unsigned_char>(&this->builder,SVar12,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,uVar5);
      break;
    case UINT16:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_08 = capnp::schema::Value::Reader::getUint16((Reader *)local_118);
      uVar9 = (anonymous_namespace)::bitCast<unsigned_short,unsigned_short>(value_08);
      uVar9 = _::StructBuilder::getDataField<unsigned_short>(&this->builder,SVar12,uVar9);
      DynamicValue::Builder::Builder(__return_storage_ptr__,uVar9);
      break;
    case UINT32:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      uVar13 = capnp::schema::Value::Reader::getUint32((Reader *)local_118);
      uVar11 = (anonymous_namespace)::bitCast<unsigned_int,unsigned_int>(uVar13);
      uVar11 = _::StructBuilder::getDataField<unsigned_int>(&this->builder,SVar12,uVar11);
      DynamicValue::Builder::Builder(__return_storage_ptr__,uVar11);
      break;
    case UINT64:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      uVar16 = capnp::schema::Value::Reader::getUint64((Reader *)local_118);
      uVar18 = (anonymous_namespace)::bitCast<unsigned_long,unsigned_long>(uVar16);
      uVar18 = _::StructBuilder::getDataField<unsigned_long>(&this->builder,SVar12,uVar18);
      DynamicValue::Builder::Builder(__return_storage_ptr__,uVar18);
      break;
    case FLOAT32:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      fVar19 = capnp::schema::Value::Reader::getFloat32((Reader *)local_118);
      uVar13 = (anonymous_namespace)::bitCast<unsigned_int,float>(fVar19);
      fVar19 = _::StructBuilder::getDataField<float>(&this->builder,SVar12,uVar13);
      DynamicValue::Builder::Builder(__return_storage_ptr__,fVar19);
      break;
    case FLOAT64:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      dVar1 = capnp::schema::Value::Reader::getFloat64((Reader *)local_118);
      uVar16 = (anonymous_namespace)::bitCast<unsigned_long,double>(dVar1);
      dVar1 = _::StructBuilder::getDataField<double>(&this->builder,SVar12,uVar16);
      DynamicValue::Builder::Builder(__return_storage_ptr__,dVar1);
      break;
    case TEXT:
      bVar3 = capnp::schema::Value::Reader::isAnyPointer((Reader *)local_118);
      if (bVar3) {
        memset(local_148,0,0x10);
        Text::Reader::Reader((Reader *)local_148);
      }
      else {
        _local_148 = (ArrayPtr<const_char>)
                     capnp::schema::Value::Reader::getText((Reader *)local_118);
      }
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar14 = assumePointerOffset(uVar13);
      _::StructBuilder::getPointerField
                ((PointerBuilder *)&typedDval_2.super_ArrayPtr<const_unsigned_char>.size_,
                 &this->builder,SVar14);
      defaultValue = kj::StringPtr::begin((StringPtr *)local_148);
      sVar17 = kj::StringPtr::size((StringPtr *)local_148);
      uVar18 = assumeMax<536870910ul,unsigned_long>(sVar17);
      _::PointerBuilder::getBlob<capnp::Text>
                (&local_160,(PointerBuilder *)&typedDval_2.super_ArrayPtr<const_unsigned_char>.size_
                 ,defaultValue,(ByteCount)uVar18);
      value.content.ptr = local_160.content.ptr;
      value._0_8_ = local_160._0_8_;
      value.content.size_ = local_160.content.size_;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value);
      break;
    case DATA:
      bVar3 = capnp::schema::Value::Reader::isAnyPointer((Reader *)local_118);
      if (bVar3) {
        memset(local_188,0,0x10);
        Data::Reader::Reader((Reader *)local_188);
      }
      else {
        _local_188 = (ArrayPtr<const_unsigned_char>)
                     capnp::schema::Value::Reader::getData((Reader *)local_118);
      }
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar14 = assumePointerOffset(uVar13);
      _::StructBuilder::getPointerField
                ((PointerBuilder *)&listType.elementType.field_4,&this->builder,SVar14);
      defaultValue_00 =
           kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)local_188);
      sVar17 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)local_188);
      uVar18 = assumeBits<29u,unsigned_long>(sVar17);
      value_11 = _::PointerBuilder::getBlob<capnp::Data>
                           ((PointerBuilder *)&listType.elementType.field_4,defaultValue_00,
                            (ByteCount)uVar18);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_11);
      break;
    case LIST:
      _local_1c0 = (Type)capnp::Type::asList((Type *)&slot._reader.nestingLimit);
      WVar7 = ListSchema::whichElementType((ListSchema *)local_1c0);
      TVar2 = _local_1c0;
      _local_1c0 = TVar2;
      if (WVar7 == STRUCT) {
        local_208.baseType = local_1c0._0_2_;
        local_208.listDepth = local_1c0[2];
        local_208.isImplicitParam = (bool)local_1c0[3];
        local_208.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_1c0._4_2_;
        local_208._6_2_ = local_1c0._6_2_;
        local_208.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)listType.elementType._0_8_;
        uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit)
        ;
        SVar14 = assumePointerOffset(uVar13);
        _::StructBuilder::getPointerField(&local_248,&this->builder,SVar14);
        local_258.raw =
             (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)local_1c0);
        local_24c = anon_unknown_70::structSizeFromSchema((StructSchema)local_258.raw);
        bVar3 = capnp::schema::Value::Reader::isAnyPointer((Reader *)local_118);
        if (bVar3) {
          local_5d8 = (word *)0x0;
        }
        else {
          capnp::schema::Value::Reader::getList(&local_278,(Reader *)local_118);
          local_5d8 = AnyPointer::Reader::getAs<capnp::_::UncheckedMessage>(&local_278);
        }
        _::PointerBuilder::getStructList(&local_230,&local_248,local_24c,local_5d8);
        schema_00.elementType.field_4.schema = local_208.field_4.schema;
        schema_00.elementType.baseType = local_208.baseType;
        schema_00.elementType.listDepth = local_208.listDepth;
        schema_00.elementType.isImplicitParam = local_208.isImplicitParam;
        schema_00.elementType.field_3 = local_208.field_3;
        schema_00.elementType._6_2_ = local_208._6_2_;
        builder_00.capTable = local_230.capTable;
        builder_00.segment = local_230.segment;
        builder_00.ptr = local_230.ptr;
        builder_00.elementCount = local_230.elementCount;
        builder_00.step = local_230.step;
        builder_00.structDataSize = local_230.structDataSize;
        builder_00.structPointerCount = local_230.structPointerCount;
        builder_00.elementSize = local_230.elementSize;
        builder_00._39_1_ = local_230._39_1_;
        DynamicList::Builder::Builder(&local_1f8,schema_00,builder_00);
        value_03.schema.elementType.field_4.schema = local_1f8.schema.elementType.field_4.schema;
        value_03.schema.elementType.baseType = local_1f8.schema.elementType.baseType;
        value_03.schema.elementType.listDepth = local_1f8.schema.elementType.listDepth;
        value_03.schema.elementType.isImplicitParam = local_1f8.schema.elementType.isImplicitParam;
        value_03.schema.elementType.field_3 = local_1f8.schema.elementType.field_3;
        value_03.schema.elementType._6_2_ = local_1f8.schema.elementType._6_2_;
        value_03.builder.segment = local_1f8.builder.segment;
        value_03.builder.capTable = local_1f8.builder.capTable;
        value_03.builder.ptr = local_1f8.builder.ptr;
        value_03.builder.elementCount = local_1f8.builder.elementCount;
        value_03.builder.step = local_1f8.builder.step;
        value_03.builder.structDataSize = local_1f8.builder.structDataSize;
        value_03.builder.structPointerCount = local_1f8.builder.structPointerCount;
        value_03.builder.elementSize = local_1f8.builder.elementSize;
        value_03.builder._39_1_ = local_1f8.builder._39_1_;
        DynamicValue::Builder::Builder(__return_storage_ptr__,value_03);
      }
      else {
        local_2c0.baseType = local_1c0._0_2_;
        local_2c0.listDepth = local_1c0[2];
        local_2c0.isImplicitParam = (bool)local_1c0[3];
        local_2c0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_1c0._4_2_;
        local_2c0._6_2_ = local_1c0._6_2_;
        local_2c0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)listType.elementType._0_8_;
        uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit)
        ;
        SVar14 = assumePointerOffset(uVar13);
        _::StructBuilder::getPointerField(&local_300,&this->builder,SVar14);
        WVar7 = ListSchema::whichElementType((ListSchema *)local_1c0);
        elementSize = anon_unknown_70::elementSizeFor(WVar7);
        bVar3 = capnp::schema::Value::Reader::isAnyPointer((Reader *)local_118);
        if (bVar3) {
          local_5f0 = (word *)0x0;
        }
        else {
          capnp::schema::Value::Reader::getList((Reader *)&structSchema,(Reader *)local_118);
          local_5f0 = AnyPointer::Reader::getAs<capnp::_::UncheckedMessage>((Reader *)&structSchema)
          ;
        }
        _::PointerBuilder::getList(&local_2e8,&local_300,elementSize,local_5f0);
        schema.elementType.field_4.schema = local_2c0.field_4.schema;
        schema.elementType.baseType = local_2c0.baseType;
        schema.elementType.listDepth = local_2c0.listDepth;
        schema.elementType.isImplicitParam = local_2c0.isImplicitParam;
        schema.elementType.field_3 = local_2c0.field_3;
        schema.elementType._6_2_ = local_2c0._6_2_;
        builder_01.capTable = local_2e8.capTable;
        builder_01.segment = local_2e8.segment;
        builder_01.ptr = local_2e8.ptr;
        builder_01.elementCount = local_2e8.elementCount;
        builder_01.step = local_2e8.step;
        builder_01.structDataSize = local_2e8.structDataSize;
        builder_01.structPointerCount = local_2e8.structPointerCount;
        builder_01.elementSize = local_2e8.elementSize;
        builder_01._39_1_ = local_2e8._39_1_;
        DynamicList::Builder::Builder(&local_2b0,schema,builder_01);
        value_04.schema.elementType.field_4.schema = local_2b0.schema.elementType.field_4.schema;
        value_04.schema.elementType.baseType = local_2b0.schema.elementType.baseType;
        value_04.schema.elementType.listDepth = local_2b0.schema.elementType.listDepth;
        value_04.schema.elementType.isImplicitParam = local_2b0.schema.elementType.isImplicitParam;
        value_04.schema.elementType.field_3 = local_2b0.schema.elementType.field_3;
        value_04.schema.elementType._6_2_ = local_2b0.schema.elementType._6_2_;
        value_04.builder.segment = local_2b0.builder.segment;
        value_04.builder.capTable = local_2b0.builder.capTable;
        value_04.builder.ptr = local_2b0.builder.ptr;
        value_04.builder.elementCount = local_2b0.builder.elementCount;
        value_04.builder.step = local_2b0.builder.step;
        value_04.builder.structDataSize = local_2b0.builder.structDataSize;
        value_04.builder.structPointerCount = local_2b0.builder.structPointerCount;
        value_04.builder.elementSize = local_2b0.builder.elementSize;
        value_04.builder._39_1_ = local_2b0.builder._39_1_;
        DynamicValue::Builder::Builder(__return_storage_ptr__,value_04);
      }
      break;
    case ENUM:
      local_11c = capnp::schema::Value::Reader::getEnum((Reader *)local_118);
      typedDval_1.super_StringPtr.content.size_ =
           (size_t)capnp::Type::asEnum((Type *)&slot._reader.nestingLimit);
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      uVar9 = _::StructBuilder::getDataField<unsigned_short>(&this->builder,SVar12,local_11c);
      DynamicEnum::DynamicEnum
                (&local_130,(EnumSchema)typedDval_1.super_StringPtr.content.size_,uVar9);
      value_12._10_6_ = 0;
      value_12.schema.super_Schema.raw = local_130.schema.super_Schema.raw;
      value_12.value = local_130.value;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_12);
      break;
    case STRUCT:
      local_360.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)&slot._reader.nestingLimit);
      local_328.raw = local_360.raw;
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar14 = assumePointerOffset(uVar13);
      _::StructBuilder::getPointerField(&local_3a0,&this->builder,SVar14);
      local_3b0.raw = local_328.raw;
      local_3a4 = anon_unknown_70::structSizeFromSchema((StructSchema)local_328.raw);
      bVar3 = capnp::schema::Value::Reader::isAnyPointer((Reader *)local_118);
      if (bVar3) {
        local_600 = (word *)0x0;
      }
      else {
        capnp::schema::Value::Reader::getStruct(&local_3d0,(Reader *)local_118);
        local_600 = AnyPointer::Reader::getAs<capnp::_::UncheckedMessage>(&local_3d0);
      }
      _::PointerBuilder::getStruct(&local_388,&local_3a0,local_3a4,local_600);
      builder_02.capTable = local_388.capTable;
      builder_02.segment = local_388.segment;
      builder_02.data = local_388.data;
      builder_02.pointers = local_388.pointers;
      builder_02.dataSize = local_388.dataSize;
      builder_02.pointerCount = local_388.pointerCount;
      builder_02._38_2_ = local_388._38_2_;
      Builder(&local_358,(StructSchema)local_360.raw,builder_02);
      value_01.builder.segment = local_358.builder.segment;
      value_01.schema.super_Schema.raw = local_358.schema.super_Schema.raw;
      value_01.builder.capTable = local_358.builder.capTable;
      value_01.builder.data = local_358.builder.data;
      value_01.builder.pointers = local_358.builder.pointers;
      value_01.builder.dataSize = local_358.builder.dataSize;
      value_01.builder.pointerCount = local_358.builder.pointerCount;
      value_01.builder._38_2_ = local_358.builder._38_2_;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_01);
      break;
    case INTERFACE:
      local_430.pointer =
           (WirePointer *)capnp::Type::asInterface((Type *)&slot._reader.nestingLimit);
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar14 = assumePointerOffset(uVar13);
      _::StructBuilder::getPointerField(&local_448,&this->builder,SVar14);
      _::PointerBuilder::getCapability(&local_430);
      DynamicCapability::Client::Client
                (&local_418,(InterfaceSchema)local_430.pointer,(Own<capnp::ClientHook> *)&local_430)
      ;
      DynamicValue::Builder::Builder(__return_storage_ptr__,&local_418);
      DynamicCapability::Client::~Client(&local_418);
      kj::Own<capnp::ClientHook>::~Own((Own<capnp::ClientHook> *)&local_430);
      break;
    case ANY_POINTER:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar14 = assumePointerOffset(uVar13);
      _::StructBuilder::getPointerField(&local_400,&this->builder,SVar14);
      builder.capTable = local_400.capTable;
      builder.segment = local_400.segment;
      builder.pointer = local_400.pointer;
      AnyPointer::Builder::Builder(&local_3e8,builder);
      value_00.builder.capTable = local_3e8.builder.capTable;
      value_00.builder.segment = local_3e8.builder.segment;
      value_00.builder.pointer = local_3e8.builder.pointer;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_00);
      break;
    default:
      kj::_::unreachable();
    }
  }
  else {
    if (WVar6 != GROUP) {
      kj::_::unreachable();
    }
    local_480.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)&slot._reader.nestingLimit);
    memcpy(&local_4a8,&this->builder,0x28);
    builder_03.capTable = (CapTableBuilder *)uStack_4a0;
    builder_03.segment = (SegmentBuilder *)local_4a8;
    builder_03.data = (void *)local_498;
    builder_03.pointers = (WirePointer *)uStack_490;
    builder_03.dataSize = (undefined4)local_488;
    builder_03.pointerCount = local_488._4_2_;
    builder_03._38_2_ = local_488._6_2_;
    Builder(&local_478,(StructSchema)local_480.raw,builder_03);
    value_02.builder.segment = local_478.builder.segment;
    value_02.schema.super_Schema.raw = local_478.schema.super_Schema.raw;
    value_02.builder.capTable = local_478.builder.capTable;
    value_02.builder.data = local_478.builder.data;
    value_02.builder.pointers = local_478.builder.pointers;
    value_02.builder.dataSize = local_478.builder.dataSize;
    value_02.builder.pointerCount = local_478.builder.pointerCount;
    value_02.builder._38_2_ = local_478.builder._38_2_;
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_02);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder DynamicStruct::Builder::get(StructSchema::Field field) {
  KJ_REQUIRE(field.getContainingStruct() == schema, "`field` is not a field of this struct.");
  verifySetInUnion(field);

  auto proto = field.getProto();
  auto type = field.getType();
  switch (proto.which()) {
    case schema::Field::SLOT: {
      auto slot = proto.getSlot();

      // Note that the default value might be "anyPointer" even if the type is some poniter type
      // *other than* anyPointer. This happens with generics -- the field is actually a generic
      // parameter that has been bound, but the default value was of course compiled without any
      // binding available.
      auto dval = slot.getDefaultValue();

      switch (type.which()) {
        case schema::Type::VOID:
          return builder.getDataField<Void>(assumeDataOffset(slot.getOffset()));

#define HANDLE_TYPE(discrim, titleCase, type) \
        case schema::Type::discrim: \
          return builder.getDataField<type>( \
              assumeDataOffset(slot.getOffset()), \
              bitCast<_::Mask<type>>(dval.get##titleCase()));

        HANDLE_TYPE(BOOL, Bool, bool)
        HANDLE_TYPE(INT8, Int8, int8_t)
        HANDLE_TYPE(INT16, Int16, int16_t)
        HANDLE_TYPE(INT32, Int32, int32_t)
        HANDLE_TYPE(INT64, Int64, int64_t)
        HANDLE_TYPE(UINT8, Uint8, uint8_t)
        HANDLE_TYPE(UINT16, Uint16, uint16_t)
        HANDLE_TYPE(UINT32, Uint32, uint32_t)
        HANDLE_TYPE(UINT64, Uint64, uint64_t)
        HANDLE_TYPE(FLOAT32, Float32, float)
        HANDLE_TYPE(FLOAT64, Float64, double)

#undef HANDLE_TYPE

        case schema::Type::ENUM: {
          uint16_t typedDval = dval.getEnum();
          return DynamicEnum(type.asEnum(),
              builder.getDataField<uint16_t>(assumeDataOffset(slot.getOffset()), typedDval));
        }

        case schema::Type::TEXT: {
          Text::Reader typedDval = dval.isAnyPointer() ? Text::Reader() : dval.getText();
          return builder.getPointerField(assumePointerOffset(slot.getOffset()))
                        .getBlob<Text>(typedDval.begin(),
                            assumeMax<MAX_TEXT_SIZE>(typedDval.size()) * BYTES);
        }

        case schema::Type::DATA: {
          Data::Reader typedDval = dval.isAnyPointer() ? Data::Reader() : dval.getData();
          return builder.getPointerField(assumePointerOffset(slot.getOffset()))
                        .getBlob<Data>(typedDval.begin(),
                            assumeBits<BLOB_SIZE_BITS>(typedDval.size()) * BYTES);
        }

        case schema::Type::LIST: {
          ListSchema listType = type.asList();
          if (listType.whichElementType() == schema::Type::STRUCT) {
            return DynamicList::Builder(listType,
                builder.getPointerField(assumePointerOffset(slot.getOffset()))
                       .getStructList(structSizeFromSchema(listType.getStructElementType()),
                                      dval.isAnyPointer() ? nullptr :
                                          dval.getList().getAs<_::UncheckedMessage>()));
          } else {
            return DynamicList::Builder(listType,
                builder.getPointerField(assumePointerOffset(slot.getOffset()))
                       .getList(elementSizeFor(listType.whichElementType()),
                                dval.isAnyPointer() ? nullptr :
                                    dval.getList().getAs<_::UncheckedMessage>()));
          }
        }

        case schema::Type::STRUCT: {
          auto structSchema = type.asStruct();
          return DynamicStruct::Builder(structSchema,
              builder.getPointerField(assumePointerOffset(slot.getOffset()))
                     .getStruct(structSizeFromSchema(structSchema),
                                dval.isAnyPointer() ? nullptr :
                                    dval.getStruct().getAs<_::UncheckedMessage>()));
        }

        case schema::Type::ANY_POINTER:
          return AnyPointer::Builder(
              builder.getPointerField(assumePointerOffset(slot.getOffset())));

        case schema::Type::INTERFACE:
          return DynamicCapability::Client(type.asInterface(),
              builder.getPointerField(assumePointerOffset(slot.getOffset())).getCapability());
      }

      KJ_UNREACHABLE;
    }

    case schema::Field::GROUP:
      return DynamicStruct::Builder(type.asStruct(), builder);
  }

  KJ_UNREACHABLE;
}